

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5FilterMethod(sqlite3_vtab_cursor *pCursor,int idxNum,char *zUnused,int nVal,
                    sqlite3_value **apVal)

{
  sqlite3_vtab_cursor *__s;
  char **pzErr;
  Fts5FullTable *pTab;
  Fts5Config *pConfig;
  char **ppcVar1;
  Fts5Cursor *pFVar2;
  Fts5Storage *p;
  uint uVar3;
  int iVar4;
  sqlite3_vtab *psVar5;
  char *pcVar6;
  char *pcVar7;
  sqlite3_value *pVal;
  ulong uVar8;
  sqlite3_value *pVal_00;
  uint uVar9;
  sqlite3_value *psVar10;
  bool bVar11;
  bool bVar12;
  char *zRank;
  sqlite3_value *local_48;
  sqlite3_vtab_cursor local_40;
  sqlite3_vtab_cursor local_38;
  
  pTab = (Fts5FullTable *)pCursor->pVtab;
  pConfig = (pTab->p).pConfig;
  ppcVar1 = pConfig->pzErrmsg;
  __s = pCursor + 4;
  if (*(int *)&pCursor[4].pVtab != 0) {
    fts5FreeCursorComponents((Fts5Cursor *)pCursor);
    memset(__s,0,0x98);
  }
  pzErr = &(pTab->p).base.zErrMsg;
  pConfig->pzErrmsg = pzErr;
  bVar11 = (idxNum & 1U) != 0;
  if (bVar11) {
    bVar12 = *apVal == (sqlite3_value *)0x0;
  }
  else {
    bVar12 = true;
  }
  uVar9 = (uint)bVar11;
  if ((idxNum & 2U) == 0) {
    local_48 = (sqlite3_value *)0x0;
  }
  else {
    uVar8 = (ulong)uVar9;
    uVar9 = uVar9 + 1;
    local_48 = apVal[uVar8];
  }
  if ((idxNum & 4U) == 0) {
    psVar10 = (sqlite3_value *)0x0;
  }
  else {
    uVar8 = (ulong)uVar9;
    uVar9 = uVar9 + 1;
    psVar10 = apVal[uVar8];
  }
  if ((idxNum & 8U) == 0) {
    pVal_00 = (sqlite3_value *)0x0;
  }
  else {
    uVar8 = (ulong)uVar9;
    uVar9 = uVar9 + 1;
    pVal_00 = apVal[uVar8];
  }
  if ((idxNum & 0x10U) == 0) {
    pVal = (sqlite3_value *)0x0;
  }
  else {
    pVal = apVal[uVar9];
  }
  uVar9 = (idxNum & 0x80U) >> 7;
  *(uint *)((long)&pCursor[4].pVtab + 4) = uVar9;
  if (psVar10 != (sqlite3_value *)0x0) {
    pVal = psVar10;
    pVal_00 = psVar10;
  }
  psVar5 = (sqlite3_vtab *)fts5GetRowidLimit(pVal_00,0x7fffffffffffffff);
  pCursor[(ulong)((idxNum & 0x80U) == 0) + 5].pVtab = psVar5;
  psVar5 = (sqlite3_vtab *)fts5GetRowidLimit(pVal,-0x8000000000000000);
  pCursor[(ulong)uVar9 + 5].pVtab = psVar5;
  pFVar2 = pTab->pSortCsr;
  if (pFVar2 == (Fts5Cursor *)0x0) {
    if (bVar12) {
      if (pConfig->zContent == (char *)0x0) {
        pcVar7 = sqlite3_mprintf("%s: table does not support scanning",pConfig->zName);
        *pConfig->pzErrmsg = pcVar7;
        uVar3 = 1;
      }
      else {
        *(uint *)&__s->pVtab = (psVar10 != (sqlite3_value *)0x0) + 5;
        p = pTab->pStorage;
        uVar9 = 2;
        if (psVar10 == (sqlite3_value *)0x0) {
          uVar9 = (uint)(*(int *)((long)&pCursor[4].pVtab + 4) != 0);
        }
        uVar3 = fts5StorageGetStmt(p,uVar9,(sqlite3_stmt **)(pCursor + 7),pzErr);
        if (uVar3 == 0) {
          p->aStmt[uVar9] = (sqlite3_stmt *)0x0;
          psVar5 = pCursor[7].pVtab;
          if (*(int *)&__s->pVtab == 6) {
            sqlite3_bind_value((sqlite3_stmt *)psVar5,1,*apVal);
          }
          else {
            sqlite3_bind_int64((sqlite3_stmt *)psVar5,1,(sqlite_int64)pCursor[5].pVtab);
            sqlite3_bind_int64((sqlite3_stmt *)pCursor[7].pVtab,2,(sqlite_int64)pCursor[6].pVtab);
          }
          uVar3 = fts5NextMethod(pCursor);
        }
      }
    }
    else {
      pcVar6 = (char *)sqlite3ValueText(*apVal,'\x01');
      pcVar7 = "";
      if (pcVar6 != (char *)0x0) {
        pcVar7 = pcVar6;
      }
      if (local_48 == (sqlite3_value *)0x0) {
        if ((sqlite3_vtab *)pConfig->zRank == (sqlite3_vtab *)0x0) {
          pCursor[0xc].pVtab = (sqlite3_vtab *)"bm25";
          pCursor[0xd].pVtab = (sqlite3_vtab *)0x0;
        }
        else {
          pCursor[0xc].pVtab = (sqlite3_vtab *)pConfig->zRank;
          pCursor[0xd].pVtab = (sqlite3_vtab *)pConfig->zRankArgs;
        }
        uVar3 = 0;
      }
      else {
        pcVar6 = (char *)sqlite3ValueText(local_48,'\x01');
        local_38.pVtab = (sqlite3_vtab *)0x0;
        local_40.pVtab = (sqlite3_vtab *)0x0;
        if (pcVar6 == (char *)0x0) {
          uVar3._0_2_ = local_48->flags;
          uVar3._2_1_ = local_48->enc;
          uVar3._3_1_ = local_48->eSubtype;
          uVar3 = (uint)((0xaaaaaaaaU >> (uVar3 & 0x1f) & 1) != 0);
        }
        else {
          uVar3 = sqlite3Fts5ConfigParseRank(pcVar6,(char **)&local_38,(char **)&local_40);
        }
        if (uVar3 == 1) {
          pcVar6 = sqlite3_mprintf("parse error in rank function: %s",pcVar6);
          pCursor->pVtab->zErrMsg = pcVar6;
        }
        else if (uVar3 == 0) {
          pCursor[0xc].pVtab = local_38.pVtab;
          pCursor[0xd].pVtab = local_40.pVtab;
          *(byte *)&pCursor[10].pVtab = *(byte *)&pCursor[10].pVtab | 0x10;
        }
      }
      if (uVar3 == 0) {
        if (*pcVar7 == '*') {
          do {
            pcVar6 = pcVar7 + 1;
            pcVar7 = pcVar7 + 1;
          } while (*pcVar6 == ' ');
          for (uVar8 = 0; (pcVar7[uVar8] & 0xdfU) != 0; uVar8 = uVar8 + 1) {
          }
          *(undefined4 *)&__s->pVtab = 3;
          iVar4 = sqlite3_strnicmp("reads",pcVar7,(int)uVar8);
          if (iVar4 == 0) {
            psVar5 = (sqlite3_vtab *)(long)((pTab->p).pIndex)->nRead;
          }
          else {
            iVar4 = sqlite3_strnicmp("id",pcVar7,(int)uVar8);
            if (iVar4 != 0) {
              pcVar7 = sqlite3_mprintf("unknown special query: %.*s",uVar8 & 0xffffffff,pcVar7);
              *pzErr = pcVar7;
              uVar3 = 1;
              goto LAB_0019c9fa;
            }
            psVar5 = pCursor[3].pVtab;
          }
          pCursor[0xb].pVtab = psVar5;
          uVar3 = 0;
        }
        else {
          uVar3 = sqlite3Fts5ExprNew(pConfig,idxNum >> 0x10,pcVar7,(Fts5Expr **)(pCursor + 8),pzErr)
          ;
          if (uVar3 == 0) {
            if ((idxNum & 0x20U) == 0) {
              *(undefined4 *)&pCursor[4].pVtab = 1;
              uVar3 = fts5CursorFirst(pTab,(Fts5Cursor *)pCursor,uVar9);
            }
            else {
              *(undefined4 *)&pCursor[4].pVtab = 4;
              uVar3 = fts5CursorFirstSorted(pTab,(Fts5Cursor *)pCursor,uVar9);
            }
          }
        }
      }
    }
  }
  else {
    bVar11 = pFVar2->bDesc == 0;
    pCursor[6].pVtab = (sqlite3_vtab *)(&pFVar2->iFirstRowid)[bVar11];
    pCursor[5].pVtab = (sqlite3_vtab *)(&pFVar2->iFirstRowid)[!bVar11];
    *(undefined4 *)&pCursor[4].pVtab = 2;
    pCursor[8].pVtab = (sqlite3_vtab *)pFVar2->pExpr;
    uVar3 = fts5CursorFirst(pTab,(Fts5Cursor *)pCursor,uVar9);
  }
LAB_0019c9fa:
  pConfig->pzErrmsg = ppcVar1;
  return uVar3;
}

Assistant:

static int fts5FilterMethod(
  sqlite3_vtab_cursor *pCursor,   /* The cursor used for this query */
  int idxNum,                     /* Strategy index */
  const char *zUnused,            /* Unused */
  int nVal,                       /* Number of elements in apVal */
  sqlite3_value **apVal           /* Arguments for the indexing scheme */
){
  Fts5FullTable *pTab = (Fts5FullTable*)(pCursor->pVtab);
  Fts5Config *pConfig = pTab->p.pConfig;
  Fts5Cursor *pCsr = (Fts5Cursor*)pCursor;
  int rc = SQLITE_OK;             /* Error code */
  int iVal = 0;                   /* Counter for apVal[] */
  int bDesc;                      /* True if ORDER BY [rank|rowid] DESC */
  int bOrderByRank;               /* True if ORDER BY rank */
  sqlite3_value *pMatch = 0;      /* <tbl> MATCH ? expression (or NULL) */
  sqlite3_value *pRank = 0;       /* rank MATCH ? expression (or NULL) */
  sqlite3_value *pRowidEq = 0;    /* rowid = ? expression (or NULL) */
  sqlite3_value *pRowidLe = 0;    /* rowid <= ? expression (or NULL) */
  sqlite3_value *pRowidGe = 0;    /* rowid >= ? expression (or NULL) */
  int iCol;                       /* Column on LHS of MATCH operator */
  char **pzErrmsg = pConfig->pzErrmsg;

  UNUSED_PARAM(zUnused);
  UNUSED_PARAM(nVal);

  if( pCsr->ePlan ){
    fts5FreeCursorComponents(pCsr);
    memset(&pCsr->ePlan, 0, sizeof(Fts5Cursor) - ((u8*)&pCsr->ePlan-(u8*)pCsr));
  }

  assert( pCsr->pStmt==0 );
  assert( pCsr->pExpr==0 );
  assert( pCsr->csrflags==0 );
  assert( pCsr->pRank==0 );
  assert( pCsr->zRank==0 );
  assert( pCsr->zRankArgs==0 );

  assert( pzErrmsg==0 || pzErrmsg==&pTab->p.base.zErrMsg );
  pConfig->pzErrmsg = &pTab->p.base.zErrMsg;

  /* Decode the arguments passed through to this function.
  **
  ** Note: The following set of if(...) statements must be in the same
  ** order as the corresponding entries in the struct at the top of
  ** fts5BestIndexMethod().  */
  if( BitFlagTest(idxNum, FTS5_BI_MATCH) ) pMatch = apVal[iVal++];
  if( BitFlagTest(idxNum, FTS5_BI_RANK) ) pRank = apVal[iVal++];
  if( BitFlagTest(idxNum, FTS5_BI_ROWID_EQ) ) pRowidEq = apVal[iVal++];
  if( BitFlagTest(idxNum, FTS5_BI_ROWID_LE) ) pRowidLe = apVal[iVal++];
  if( BitFlagTest(idxNum, FTS5_BI_ROWID_GE) ) pRowidGe = apVal[iVal++];
  iCol = (idxNum>>16);
  assert( iCol>=0 && iCol<=pConfig->nCol );
  assert( iVal==nVal );
  bOrderByRank = ((idxNum & FTS5_BI_ORDER_RANK) ? 1 : 0);
  pCsr->bDesc = bDesc = ((idxNum & FTS5_BI_ORDER_DESC) ? 1 : 0);

  /* Set the cursor upper and lower rowid limits. Only some strategies 
  ** actually use them. This is ok, as the xBestIndex() method leaves the
  ** sqlite3_index_constraint.omit flag clear for range constraints
  ** on the rowid field.  */
  if( pRowidEq ){
    pRowidLe = pRowidGe = pRowidEq;
  }
  if( bDesc ){
    pCsr->iFirstRowid = fts5GetRowidLimit(pRowidLe, LARGEST_INT64);
    pCsr->iLastRowid = fts5GetRowidLimit(pRowidGe, SMALLEST_INT64);
  }else{
    pCsr->iLastRowid = fts5GetRowidLimit(pRowidLe, LARGEST_INT64);
    pCsr->iFirstRowid = fts5GetRowidLimit(pRowidGe, SMALLEST_INT64);
  }

  if( pTab->pSortCsr ){
    /* If pSortCsr is non-NULL, then this call is being made as part of 
    ** processing for a "... MATCH <expr> ORDER BY rank" query (ePlan is
    ** set to FTS5_PLAN_SORTED_MATCH). pSortCsr is the cursor that will
    ** return results to the user for this query. The current cursor 
    ** (pCursor) is used to execute the query issued by function 
    ** fts5CursorFirstSorted() above.  */
    assert( pRowidEq==0 && pRowidLe==0 && pRowidGe==0 && pRank==0 );
    assert( nVal==0 && pMatch==0 && bOrderByRank==0 && bDesc==0 );
    assert( pCsr->iLastRowid==LARGEST_INT64 );
    assert( pCsr->iFirstRowid==SMALLEST_INT64 );
    if( pTab->pSortCsr->bDesc ){
      pCsr->iLastRowid = pTab->pSortCsr->iFirstRowid;
      pCsr->iFirstRowid = pTab->pSortCsr->iLastRowid;
    }else{
      pCsr->iLastRowid = pTab->pSortCsr->iLastRowid;
      pCsr->iFirstRowid = pTab->pSortCsr->iFirstRowid;
    }
    pCsr->ePlan = FTS5_PLAN_SOURCE;
    pCsr->pExpr = pTab->pSortCsr->pExpr;
    rc = fts5CursorFirst(pTab, pCsr, bDesc);
  }else if( pMatch ){
    const char *zExpr = (const char*)sqlite3_value_text(apVal[0]);
    if( zExpr==0 ) zExpr = "";

    rc = fts5CursorParseRank(pConfig, pCsr, pRank);
    if( rc==SQLITE_OK ){
      if( zExpr[0]=='*' ){
        /* The user has issued a query of the form "MATCH '*...'". This
        ** indicates that the MATCH expression is not a full text query,
        ** but a request for an internal parameter.  */
        rc = fts5SpecialMatch(pTab, pCsr, &zExpr[1]);
      }else{
        char **pzErr = &pTab->p.base.zErrMsg;
        rc = sqlite3Fts5ExprNew(pConfig, iCol, zExpr, &pCsr->pExpr, pzErr);
        if( rc==SQLITE_OK ){
          if( bOrderByRank ){
            pCsr->ePlan = FTS5_PLAN_SORTED_MATCH;
            rc = fts5CursorFirstSorted(pTab, pCsr, bDesc);
          }else{
            pCsr->ePlan = FTS5_PLAN_MATCH;
            rc = fts5CursorFirst(pTab, pCsr, bDesc);
          }
        }
      }
    }
  }else if( pConfig->zContent==0 ){
    *pConfig->pzErrmsg = sqlite3_mprintf(
        "%s: table does not support scanning", pConfig->zName
    );
    rc = SQLITE_ERROR;
  }else{
    /* This is either a full-table scan (ePlan==FTS5_PLAN_SCAN) or a lookup
    ** by rowid (ePlan==FTS5_PLAN_ROWID).  */
    pCsr->ePlan = (pRowidEq ? FTS5_PLAN_ROWID : FTS5_PLAN_SCAN);
    rc = sqlite3Fts5StorageStmt(
        pTab->pStorage, fts5StmtType(pCsr), &pCsr->pStmt, &pTab->p.base.zErrMsg
    );
    if( rc==SQLITE_OK ){
      if( pCsr->ePlan==FTS5_PLAN_ROWID ){
        sqlite3_bind_value(pCsr->pStmt, 1, apVal[0]);
      }else{
        sqlite3_bind_int64(pCsr->pStmt, 1, pCsr->iFirstRowid);
        sqlite3_bind_int64(pCsr->pStmt, 2, pCsr->iLastRowid);
      }
      rc = fts5NextMethod(pCursor);
    }
  }

  pConfig->pzErrmsg = pzErrmsg;
  return rc;
}